

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.h
# Opt level: O3

void __thiscall webpp::Response::Response(Response *this,string *content,HttpStatus status)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  basic_streambuf<std::allocator<char>_> *pbVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ostream *poVar4;
  mapped_type *pmVar5;
  undefined1 local_49;
  basic_streambuf<std::allocator<char>_> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  HttpStatus local_34;
  element_type *local_30;
  
  (this->write_buffer).
  super___shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->write_buffer).
  super___shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->response_stream).
  super___shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->response_stream).
  super___shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->status = status;
  local_48 = (element_type *)0x0;
  local_34 = status;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<boost::asio::basic_streambuf<std::allocator<char>>,std::allocator<boost::asio::basic_streambuf<std::allocator<char>>>>
            (&_Stack_40,&local_48,
             (allocator<boost::asio::basic_streambuf<std::allocator<char>_>_> *)&local_30);
  _Var3._M_pi = _Stack_40._M_pi;
  pbVar2 = local_48;
  local_48 = (basic_streambuf<std::allocator<char>_> *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->write_buffer).
           super___shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->write_buffer).
  super___shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = pbVar2;
  (this->write_buffer).
  super___shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
    }
  }
  local_30 = (this->write_buffer).
             super___shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_48 = (basic_streambuf<std::allocator<char>_> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::ostream,std::allocator<std::ostream>,boost::asio::basic_streambuf<std::allocator<char>>*>
            (&_Stack_40,(basic_ostream<char,_std::char_traits<char>_> **)&local_48,
             (allocator<std::basic_ostream<char,_std::char_traits<char>_>_> *)&local_49,&local_30);
  _Var3._M_pi = _Stack_40._M_pi;
  pbVar2 = local_48;
  local_48 = (basic_streambuf<std::allocator<char>_> *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->response_stream).
           super___shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->response_stream).
  super___shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pbVar2;
  (this->response_stream).
  super___shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
    }
  }
  poVar4 = (ostream *)
           (this->response_stream).
           super___shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"HTTP/1.1 ",9);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,status);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  pmVar5 = std::
           map<webpp::http::HttpStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<webpp::http::HttpStatus>,_std::allocator<std::pair<const_webpp::http::HttpStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<webpp::http::HttpStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<webpp::http::HttpStatus>,_std::allocator<std::pair<const_webpp::http::HttpStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)http::HttpStatusMap_abi_cxx11_,&local_34);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(pmVar5->_M_dataplus)._M_p,pmVar5->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\r\nContent-Length: ",0x12);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\r\n\r\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(content->_M_dataplus)._M_p,content->_M_string_length);
  return;
}

Assistant:

Response(const std::string&& content,
           const http::HttpStatus status = http::OK)
      : status(status) {
    auto len = content.length();
    write_buffer = std::make_shared<boost::asio::streambuf>();
    response_stream = std::make_shared<std::ostream>(write_buffer.get());

    *response_stream << "HTTP/1.1 " << status << " "
                     << http::HttpStatusMap[status]
                     << "\r\nContent-Length: " << len << "\r\n\r\n"
                     << content;
  }